

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::Maybe
          (Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *this,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *other)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    bVar1 = (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet
    ;
    (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet = bVar1;
    if (bVar1 == true) {
      (this->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.field_1 =
           (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
           field_1;
    }
    if ((other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet ==
        true) {
      (other->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet =
           false;
    }
    *(undefined8 *)((long)&(this->ptr).field_1 + 8) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 8);
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 0x10);
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x18) =
         *(undefined8 *)((long)&(other->ptr).field_1 + 0x18);
    *(undefined8 *)((long)&(other->ptr).field_1 + 8) = 0;
    *(undefined8 *)((long)&(other->ptr).field_1 + 0x10) = 0;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    lVar2 = *(long *)((long)&(other->ptr).field_1 + 8);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&(other->ptr).field_1 + 0x10);
      *(undefined8 *)((long)&(other->ptr).field_1 + 8) = 0;
      *(undefined8 *)((long)&(other->ptr).field_1 + 0x10) = 0;
      puVar4 = *(undefined8 **)((long)&(other->ptr).field_1 + 0x18);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }